

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timeline.cpp
# Opt level: O0

void __thiscall
CMU462::Timeline::drawTriangle
          (Timeline *this,double x1,double y1,double x2,double y2,double x3,double y3)

{
  float z;
  double y3_local;
  double x3_local;
  double y2_local;
  double x2_local;
  double y1_local;
  double x1_local;
  Timeline *this_local;
  
  glBegin(4);
  glVertex3f((float)x1,(float)y1,0);
  glVertex3f((float)x2,(float)y2,0);
  glVertex3f((float)x3,(float)y3,0);
  glEnd();
  return;
}

Assistant:

void Timeline::drawTriangle(double x1, double y1,
							  double x2, double y2,
							  double x3, double y3)
  {
	  float z = 0.0;

	  glBegin(GL_TRIANGLES);
	  glVertex3f(x1, y1, z);
	  glVertex3f(x2, y2, z);
	  glVertex3f(x3, y3, z);
	  glEnd();
  }